

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplifyMathematicalExpressions.cpp
# Opt level: O1

bool isNumber(string *input)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar1 = input->_M_string_length;
  bVar6 = uVar1 == 0;
  if ((!bVar6) &&
     (pcVar2 = (input->_M_dataplus)._M_p, iVar4 = (int)*pcVar2, iVar4 == 0x2e || iVar4 - 0x30U < 10)
     ) {
    uVar3 = 1;
    do {
      uVar5 = uVar3;
      if (uVar1 == uVar5) break;
      iVar4 = (int)pcVar2[uVar5];
      uVar3 = uVar5 + 1;
    } while (iVar4 - 0x30U < 10 || iVar4 == 0x2e);
    bVar6 = uVar1 <= uVar5;
  }
  return bVar6;
}

Assistant:

bool isNumber(std::string input) {
    for (int i = 0; i < input.size(); ++i) {
        if(!std::isdigit(input[i])){
            if(input[i] == '.'){
                continue;
            }
            return false;
        }
    }
    return true;
}